

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O3

void TTD::NSSnapObjects::ParseAddtlInfo_SnapGeneratorVirtualScriptFunctionInfo
               (SnapObject *snpObject,FileReader *reader,SlabAllocator *alloc)

{
  SnapScriptFunctionInfo *snapFuncInfo;
  TTD_PTR_ID TVar1;
  
  snapFuncInfo = (SnapScriptFunctionInfo *)
                 SlabAllocatorBase<0>::SlabAllocateTypeRawSize<64ul>(alloc);
  ParseAddtlInfo_SnapScriptFunctionInfoEx(snapFuncInfo,reader,alloc);
  TVar1 = FileReader::ReadAddr(reader,objectId,true);
  *(TTD_PTR_ID *)&snapFuncInfo[1].DebugFunctionName = TVar1;
  if (snpObject->SnapObjectTag == SnapGeneratorVirtualScriptFunction) {
    snpObject->AddtlSnapObjectInfo = snapFuncInfo;
    return;
  }
  TTDAbort_unrecoverable_error("Tag does not match.");
}

Assistant:

void ParseAddtlInfo_SnapGeneratorVirtualScriptFunctionInfo(SnapObject *snpObject, FileReader *reader, SlabAllocator &alloc)
        {
            SnapGeneratorVirtualScriptFunctionInfo* sgvsf = alloc.SlabAllocateStruct<SnapGeneratorVirtualScriptFunctionInfo>();
            ParseAddtlInfo_SnapScriptFunctionInfoEx(sgvsf, reader, alloc);
            sgvsf->realFunction = reader->ReadAddr(NSTokens::Key::objectId, true);
            SnapObjectSetAddtlInfoAs<SnapGeneratorVirtualScriptFunctionInfo*, SnapObjectType::SnapGeneratorVirtualScriptFunction>(snpObject, sgvsf);
        }